

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O1

void test_bhdct_delete_then_insert_string_key(planck_unit_test_t *tc)

{
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined4 local_9c;
  char local_98 [16];
  ion_dictionary_t local_88;
  ion_dictionary_handler_t local_70;
  
  local_98[8] = 0;
  local_98[0] = '\0';
  local_98[1] = '\0';
  local_98[2] = '\0';
  local_98[3] = '\0';
  local_98[4] = '\0';
  local_98[5] = '\0';
  local_98[6] = '\0';
  local_98[7] = '\0';
  bhdct_setup_string_key(tc,&local_70,&local_88,ion_fill_edge_cases);
  sprintf(local_98,"k%d",0x3c);
  bhdct_delete(tc,&local_88,local_98,'\0',1,'\x01');
  sprintf(local_98,"k%d",4);
  bhdct_delete(tc,&local_88,local_98,'\0',1,'\x01');
  sprintf(local_98,"k%d",0x1f9);
  bhdct_delete(tc,&local_88,local_98,'\0',1,'\x01');
  sprintf(local_98,"k%d",0x3d);
  local_9c = 0x2c;
  bhdct_insert(tc,&local_88,local_98,&local_9c,'\x01');
  sprintf(local_98,"k%d",0x43);
  local_a0 = 0x2a;
  bhdct_insert(tc,&local_88,local_98,&local_a0,'\x01');
  sprintf(local_98,"k%d",0x49);
  local_a4 = 0x30;
  bhdct_insert(tc,&local_88,local_98,&local_a4,'\x01');
  bhdct_delete_dictionary(tc,&local_88);
  bhdct_close_master_table(tc);
  bhdct_delete_master_table(tc);
  return;
}

Assistant:

void
test_bhdct_delete_then_insert_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_edge_cases);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 60);
	bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 4);
	bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 505);
	bhdct_delete(tc, &dict, key, err_ok, 1, boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 61);
	bhdct_insert(tc, &dict, key, IONIZE(44, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 67);
	bhdct_insert(tc, &dict, key, IONIZE(42, int), boolean_true);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 73);
	bhdct_insert(tc, &dict, key, IONIZE(48, int), boolean_true);

	bhdct_takedown(tc, &dict);
}